

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

Image<double> *
eos::core::image::constant<double>
          (Image<double> *__return_storage_ptr__,int height,int width,double value)

{
  double *pdVar1;
  int x;
  int y;
  
  Image<double>::Image(__return_storage_ptr__,height,width);
  if (0 < height) {
    y = 0;
    do {
      if (0 < width) {
        x = 0;
        do {
          pdVar1 = Image<double>::operator()(__return_storage_ptr__,y,x);
          *pdVar1 = value;
          x = x + 1;
        } while (width != x);
      }
      y = y + 1;
    } while (y != height);
  }
  return __return_storage_ptr__;
}

Assistant:

Image<PixelType> constant(int height, int width, PixelType value) noexcept
{
    Image<PixelType> image(height, width);
    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            image(y, x) = value;
        }
    }
    return image;
}